

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_x.c
# Opt level: O1

void test_x_multiple(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_basic.zip");
  wVar1 = systemf("%s %s -x test_basic/c test_basic/b >test.out 2>test.err",testprog,
                  "test_basic.zip");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_x.c"
                      ,L'#',0,"0",(long)wVar1,"r",(void *)0x0);
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_x.c"
             ,L'$',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_x.c"
             ,L'%',"test.err");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_x.c"
             ,L'\'',"contents a\n","test_basic/a");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_x.c"
             ,L'(',"test_basic/b");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_x.c"
             ,L')',"test_basic/c");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_x.c"
             ,L'*',"contents CAPS\n","test_basic/CAPS");
  return;
}

Assistant:

DEFINE_TEST(test_x_multiple)
{
	const char *reffile = "test_basic.zip";
	int r;

	extract_reference_file(reffile);
	r = systemf("%s %s -x test_basic/c test_basic/b >test.out 2>test.err", testprog, reffile);
	assertEqualInt(0, r);
	assertNonEmptyFile("test.out");
	assertEmptyFile("test.err");

	assertTextFileContents("contents a\n", "test_basic/a");
	assertFileNotExists("test_basic/b");
	assertFileNotExists("test_basic/c");
	assertTextFileContents("contents CAPS\n", "test_basic/CAPS");
}